

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O0

void __thiscall Memory::Recycler::ScanMemory<false>(Recycler *this,void **obj,size_t byteCount)

{
  size_t byteCount_local;
  void **obj_local;
  Recycler *this_local;
  
  if (byteCount != 0) {
    ScanMemoryInline<false,false>(this,obj,byteCount);
  }
  return;
}

Assistant:

void ScanMemory(void ** obj, size_t byteCount) { if (byteCount != 0) { ScanMemoryInline<doSpecialMark>(obj, byteCount); } }